

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O3

void __thiscall
srell::regex_internal::range_pairs::set_eytzinger_layout
          (range_pairs *this,uchar21 mypos,range_pair *srcbase,uchar21 srclen,range_pair *destbase,
          uchar21 destlen)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uchar21 mypos_00;
  uchar21 srclen_00;
  uint uVar4;
  
  uVar2 = (ulong)(uint)mypos;
  uVar4 = mypos * 2;
  mypos_00 = mypos * 2 + L'\x01';
  uVar3 = uVar4;
  if (srclen != L'\0') {
    do {
      srclen_00 = (uint)srclen >> 1;
      destbase[uVar2] = srcbase[(uint)srclen_00];
      if ((uint)destlen <= (uint)mypos_00) {
        return;
      }
      set_eytzinger_layout(this,mypos_00,srcbase,srclen_00,destbase,destlen);
      srcbase = srcbase + (ulong)(uint)srclen_00 + 1;
      mypos = uVar4 + L'\x02';
      uVar2 = (ulong)(uint)mypos;
      uVar3 = uVar4 * 2 + 4;
      mypos_00 = uVar4 * 2 + L'\x05';
      srclen = ~srclen_00 + srclen;
      uVar4 = uVar3;
    } while (srclen != L'\0');
  }
  destbase[(uint)mypos].first = L'\xffffffff';
  destbase[(uint)mypos].second = L'\0';
  while ((uint)mypos_00 < (uint)destlen) {
    uVar2 = (ulong)uVar3;
    set_eytzinger_layout(this,mypos_00,srcbase,L'\0',destbase,destlen);
    iVar1 = uVar3 * 2;
    uVar3 = uVar3 * 2 + 4;
    destbase[uVar2 + 2].first = L'\xffffffff';
    destbase[uVar2 + 2].second = L'\0';
    mypos_00 = iVar1 + L'\x05';
  }
  return;
}

Assistant:

void set_eytzinger_layout(uchar21 mypos, const range_pair *srcbase, uchar21 srclen,
		range_pair *const destbase, const uchar21 destlen)
	{
		const uchar21 nextpos = (mypos << 1) + 1;

		if (srclen)
		{
			uchar21 mid = srclen >> 1;

			destbase[mypos] = srcbase[mid];

			if (nextpos < destlen)
			{
//				if (mid)
					set_eytzinger_layout(nextpos, srcbase, mid, destbase, destlen);
				++mid;
				srcbase += mid;
				srclen -= mid;
//				if (srclen)
					set_eytzinger_layout(nextpos + 1, srcbase, srclen, destbase, destlen);
			}
		}
		else
		{
			destbase[mypos].set(constants::invalid_u21value, 0);	//  -1, 0);
			if (nextpos < destlen)
			{
				set_eytzinger_layout(nextpos, srcbase, 0, destbase, destlen);
				set_eytzinger_layout(nextpos + 1, srcbase, 0, destbase, destlen);
			}
		}
	}